

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asListAnySize(ListBuilder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  StructDataBitCount SVar5;
  CapTableBuilder *pCVar6;
  ElementSize EVar7;
  SegmentBuilder *this_00;
  word *pwVar8;
  ulong uVar9;
  uint uVar10;
  OrphanBuilder *pOVar11;
  Fault local_38;
  
  uVar10 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar10 != 0) {
    this_00 = this->segment;
    pCVar6 = this->capTable;
    if ((uVar10 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar10 = (uint)(this->tag).content;
      pwVar8 = (this_00->super_SegmentReader).ptr.ptr;
      uVar9 = (ulong)(uVar10 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar8->content + uVar9);
      pOVar11 = (OrphanBuilder *)((long)&pwVar8[1].content + uVar9);
      if ((uVar10 & 4) == 0) {
        pwVar8 = &pOVar11->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar11 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar8 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar8 = this->location;
      pOVar11 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    uVar10 = (uint)(pOVar11->tag).content & 3;
    if (uVar10 == 1) {
      uVar4 = *(uint *)((long)&(pOVar11->tag).content + 4);
      EVar7 = (ElementSize)uVar4 & INLINE_COMPOSITE;
      if (EVar7 == INLINE_COMPOSITE) {
        uVar4 = (uint)pwVar8->content;
        if ((uVar4 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x575,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&local_38);
        }
        uVar2 = *(ushort *)((long)&pwVar8->content + 4);
        uVar3 = *(ushort *)((long)&pwVar8->content + 6);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar6;
        __return_storage_ptr__->ptr = (byte *)(pwVar8 + 1);
        __return_storage_ptr__->elementCount = uVar4 >> 2 & 0x1fffffff;
        __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = uVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      }
      else {
        SVar5 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar7 * 4);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar6;
        __return_storage_ptr__->ptr = (byte *)pwVar8;
        __return_storage_ptr__->elementCount = uVar4 >> 3;
        __return_storage_ptr__->step = (uint)(EVar7 == POINTER) * 0x40 + SVar5;
        __return_storage_ptr__->structDataSize = SVar5;
        __return_storage_ptr__->structPointerCount = (ushort)(EVar7 == POINTER);
        __return_storage_ptr__->elementSize = EVar7;
      }
    }
    else {
      asListAnySize();
    }
    if (uVar10 == 1) goto LAB_001875d8;
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
LAB_001875d8:
  if ((__return_storage_ptr__->elementSize == INLINE_COMPOSITE) &&
     (__return_storage_ptr__->ptr != (byte *)0x0)) {
    pwVar8 = (word *)(__return_storage_ptr__->ptr + -8);
  }
  else {
    pwVar8 = (word *)__return_storage_ptr__->ptr;
  }
  this->location = pwVar8;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asListAnySize() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointerAnySize(
      tagAsPtr(), location, segment, capTable, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}